

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethpccal.cpp
# Opt level: O0

void __thiscall
icu_63::EthiopicCalendar::handleComputeFields
          (EthiopicCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  UBool UVar1;
  int jdEpochOffset;
  int local_34;
  uint local_30;
  int32_t year;
  int32_t era;
  int32_t day;
  int32_t month;
  int32_t eyear;
  UErrorCode *param_2_local;
  EthiopicCalendar *pEStack_10;
  int32_t julianDay_local;
  EthiopicCalendar *this_local;
  
  _month = param_2;
  param_2_local._4_4_ = julianDay;
  pEStack_10 = this;
  jdEpochOffset = (*(this->super_CECalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  CECalendar::jdToCE(julianDay,jdEpochOffset,&day,&era,&year);
  UVar1 = isAmeteAlemEra(this);
  if (UVar1 == '\0') {
    if (day < 1) {
      local_34 = day + 0x157c;
    }
    else {
      local_34 = day;
    }
    local_30 = (uint)(day >= 1);
  }
  else {
    local_30 = 0;
    local_34 = day + 0x157c;
  }
  Calendar::internalSet((Calendar *)this,UCAL_EXTENDED_YEAR,day);
  Calendar::internalSet((Calendar *)this,UCAL_ERA,local_30);
  Calendar::internalSet((Calendar *)this,UCAL_YEAR,local_34);
  Calendar::internalSet((Calendar *)this,UCAL_MONTH,era);
  Calendar::internalSet((Calendar *)this,UCAL_DATE,year);
  Calendar::internalSet((Calendar *)this,UCAL_DAY_OF_YEAR,era * 0x1e + year);
  return;
}

Assistant:

void
EthiopicCalendar::handleComputeFields(int32_t julianDay, UErrorCode &/*status*/)
{
    int32_t eyear, month, day, era, year;
    jdToCE(julianDay, getJDEpochOffset(), eyear, month, day);

    if (isAmeteAlemEra()) {
        era = AMETE_ALEM;
        year = eyear + AMETE_MIHRET_DELTA;
    } else {
        if (eyear > 0) {
            era = AMETE_MIHRET;
            year = eyear;
        } else {
            era = AMETE_ALEM;
            year = eyear + AMETE_MIHRET_DELTA;
        }
    }

    internalSet(UCAL_EXTENDED_YEAR, eyear);
    internalSet(UCAL_ERA, era);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DATE, day);
    internalSet(UCAL_DAY_OF_YEAR, (30 * month) + day);
}